

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O0

bool __thiscall BufferedFileReader::gotoByte(BufferedFileReader *this,int readerID,int64_t seekDist)

{
  ReaderData *pRVar1;
  int64_t iVar2;
  long local_58;
  bool rez;
  uint64_t seekRez;
  FileReaderData *data;
  int64_t seekDist_local;
  int readerID_local;
  BufferedFileReader *this_local;
  
  pRVar1 = BufferedReader::getReader(&this->super_BufferedReader,readerID);
  if (pRVar1 == (ReaderData *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = __dynamic_cast(pRVar1,&ReaderData::typeinfo,&FileReaderData::typeinfo,0);
  }
  if (local_58 == 0) {
    this_local._7_1_ = false;
  }
  else {
    *(uint32_t *)(local_58 + 0x30) =
         (this->super_BufferedReader).super_AbstractReader.m_blockSize -
         (int)((ulong)seekDist %
              (ulong)(this->super_BufferedReader).super_AbstractReader.m_blockSize);
    iVar2 = File::seek((File *)(local_58 + 0x60),seekDist + (ulong)*(uint *)(local_58 + 0x98),
                       smBegin);
    this_local._7_1_ = iVar2 != -1;
    if (this_local._7_1_) {
      *(undefined1 *)(local_58 + 0x13) = 0;
      *(undefined1 *)(local_58 + 9) = 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BufferedFileReader::gotoByte(const int readerID, const int64_t seekDist)
{
    const auto data = dynamic_cast<FileReaderData*>(getReader(readerID));
    if (data)
    {
        data->m_blockSize = m_blockSize - static_cast<uint32_t>(seekDist % static_cast<uint64_t>(m_blockSize));
        const uint64_t seekRez = data->m_file.seek(seekDist + data->m_fileHeaderSize, File::SeekMethod::smBegin);
        const bool rez = seekRez != static_cast<uint64_t>(-1);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}